

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O3

Reals __thiscall
Omega_h::get_recip_length_weights
          (Omega_h *this,Mesh *mesh,Adj *surf_verts2edges,LOs *edge2surf_edge)

{
  int *piVar1;
  undefined8 uVar2;
  Alloc *pAVar3;
  LO size_in;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  long lVar5;
  double dVar6;
  Reals RVar7;
  Reals edge2weight;
  Write<double> edge2weight_w;
  Reals edge2len;
  type f;
  undefined1 local_118 [32];
  Alloc *local_f8;
  long local_f0;
  Write<double> local_e8;
  LOs local_d8;
  Read<signed_char> local_c8;
  Write<double> local_b8;
  Alloc *local_a8;
  long local_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Alloc *local_78;
  long lStack_70;
  Write<double> local_68;
  Alloc *local_58;
  void *local_50;
  Alloc *local_48;
  void *local_40;
  Alloc *local_38;
  long local_30;
  
  measure_edges_real((Omega_h *)&local_a8,mesh);
  size_in = Mesh::nedges(mesh);
  local_118._0_8_ = (Alloc *)(local_118 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  Write<double>::Write(&local_e8,size_in,(string *)local_118);
  if ((Alloc *)local_118._0_8_ != (Alloc *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  local_58 = (edge2surf_edge->write_).shared_alloc_.alloc;
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)(local_58->size * 8 + 1);
    }
    else {
      local_58->use_count = local_58->use_count + 1;
    }
  }
  local_50 = (edge2surf_edge->write_).shared_alloc_.direct_ptr;
  local_48 = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40 = local_e8.shared_alloc_.direct_ptr;
  local_38 = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38 = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  local_30 = local_a0;
  local_98 = local_58;
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_58->size * 8 + 1);
    }
    else {
      local_58->use_count = local_58->use_count + 1;
    }
  }
  local_88 = local_48;
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_48->size * 8 + 1);
    }
    else {
      local_48->use_count = local_48->use_count + 1;
    }
  }
  pvStack_80 = local_e8.shared_alloc_.direct_ptr;
  local_78 = local_38;
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_38->size * 8 + 1);
    }
    else {
      local_38->use_count = local_38->use_count + 1;
    }
  }
  lStack_70 = local_a0;
  pvStack_90 = local_50;
  if (0 < size_in) {
    local_118._0_8_ = local_98;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_118._0_8_ = local_98->size * 8 + 1;
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    local_118._24_8_ = local_e8.shared_alloc_.direct_ptr;
    local_118._16_8_ = local_88;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_118._16_8_ = local_88->size * 8 + 1;
    }
    local_88 = (Alloc *)0x0;
    pvStack_80 = (void *)0x0;
    local_f0 = local_a0;
    local_f8 = local_78;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_f8 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    lStack_70 = 0;
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      if (*(int *)((long)local_50 + lVar5 * 4) == -1) {
        dVar6 = 0.0;
      }
      else {
        dVar6 = 1.0 / *(double *)(local_a0 + lVar5 * 8);
      }
      *(double *)((long)local_e8.shared_alloc_.direct_ptr + lVar5 * 8) = dVar6;
      lVar5 = lVar5 + 1;
    } while (size_in != (int)lVar5);
    local_118._8_8_ = local_50;
    get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)local_118);
  }
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_98);
  local_b8.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_b8.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b8.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_118,&local_b8);
  pAVar3 = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_b8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_d8.write_.shared_alloc_.alloc =
       (surf_verts2edges->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.write_.shared_alloc_.alloc)->use_count =
           (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr =
       (surf_verts2edges->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_c8.write_.shared_alloc_.alloc = (Alloc *)local_118._0_8_;
  if ((local_118._0_8_ & 7) == 0 && (Alloc *)local_118._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_118._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_118._0_8_ + 0x30) = *(int *)(local_118._0_8_ + 0x30) + 1;
    }
  }
  local_c8.write_.shared_alloc_.direct_ptr = (void *)local_118._8_8_;
  unmap<double>((Omega_h *)&local_68,&local_d8,&local_c8,1);
  Read<double>::Read((Read<signed_char> *)this,&local_68);
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(local_68.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_c8.write_.shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  uVar2 = local_118._0_8_;
  if ((local_118._0_8_ & 7) == 0 && (Alloc *)local_118._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_118._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_118._0_8_);
      operator_delete((void *)uVar2,0x48);
    }
  }
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_58);
  pvVar4 = extraout_RDX;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(local_e8.shared_alloc_.alloc,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    piVar1 = &local_a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8);
      operator_delete(local_a8,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals get_recip_length_weights(
    Mesh* mesh, Adj surf_verts2edges, LOs edge2surf_edge) {
  auto edge2len = measure_edges_real(mesh);
  auto nedges = mesh->nedges();
  auto edge2weight_w = Write<Real>(nedges);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (edge2surf_edge[edge] == -1)
      edge2weight_w[edge] = 0.0;
    else
      edge2weight_w[edge] = 1.0 / edge2len[edge];
  };
  parallel_for(nedges, f, "get_recip_length_weights");
  auto edge2weight = Reals(edge2weight_w);
  return unmap(surf_verts2edges.ab2b, edge2weight, 1);
}